

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

DescriptorFlags __thiscall
Js::CrossSiteObject<Js::GlobalObject>::GetSetter
          (CrossSiteObject<Js::GlobalObject> *this,JavascriptString *propertyNameString,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  DescriptorFlags DVar1;
  Var pvVar2;
  DescriptorFlags flags;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  JavascriptString *propertyNameString_local;
  CrossSiteObject<Js::GlobalObject> *this_local;
  
  DVar1 = GlobalObject::GetSetter
                    (&this->super_GlobalObject,propertyNameString,setterValue,info,requestContext);
  if (((DVar1 & Accessor) == Accessor) && (*setterValue != (Var)0x0)) {
    PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
    pvVar2 = CrossSite::MarshalVar(requestContext,*setterValue,false);
    *setterValue = pvVar2;
  }
  return DVar1;
}

Assistant:

DescriptorFlags CrossSiteObject<T>::GetSetter(JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DescriptorFlags flags = __super::GetSetter(propertyNameString, setterValue, info, requestContext);
        if ((flags & Accessor) == Accessor && *setterValue)
        {
            PropertyValueInfo::SetNoCache(info, this);
            *setterValue = CrossSite::MarshalVar(requestContext, *setterValue);
        }
        return flags;
    }